

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall
r_exec::IPGMContext::getMember
          (IPGMContext *this,void **object,uint64_t *view_oid,ObjectType *object_type,
          int16_t *member_index)

{
  View *view;
  char cVar1;
  byte bVar2;
  uint16_t uVar3;
  undefined2 uVar4;
  uint uVar5;
  Code *object_00;
  Atom *pAVar6;
  Code *pCVar7;
  Group *pGVar8;
  allocator local_191;
  string local_190 [39];
  string local_169;
  IPGMContext local_168;
  IPGMContext local_138;
  IPGMContext local_108;
  uint16_t local_d4;
  ushort local_d2;
  undefined1 local_d0 [4];
  uint16_t i;
  uint16_t atom_count;
  undefined1 local_a0 [8];
  IPGMContext c;
  undefined1 local_60 [8];
  IPGMContext cptr;
  int16_t *member_index_local;
  ObjectType *object_type_local;
  uint64_t *view_oid_local;
  void **object_local;
  IPGMContext *this_local;
  
  cptr.view = (View *)member_index;
  operator[](this,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 != -0x7c) {
    *object = (void *)0x0;
    *object_type = TYPE_UNDEFINED;
    *(undefined2 *)&((cptr.view)->super_View).super__Object._vptr__Object = 0;
    return;
  }
  pAVar6 = (this->super__Context).code;
  pCVar7 = this->object;
  view = this->view;
  operator[](this,0);
  uVar3 = r_code::Atom::asIndex();
  IPGMContext((IPGMContext *)local_60,pCVar7,view,pAVar6,uVar3,
              (InputLessPGMOverlay *)(this->super__Context).overlay,(this->super__Context).data);
  operator[]((IPGMContext *)local_60,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 != -0x40) {
    *object = (void *)0x0;
    *object_type = TYPE_UNDEFINED;
    *(undefined2 *)&((cptr.view)->super_View).super__Object._vptr__Object = 0;
    c.view._0_4_ = 1;
    goto LAB_00212b52;
  }
  getChild((IPGMContext *)local_d0,(IPGMContext *)local_60,1);
  operator*((IPGMContext *)local_a0,(IPGMContext *)local_d0);
  ~IPGMContext((IPGMContext *)local_d0);
  local_d2 = getChildrenCount((IPGMContext *)local_60);
  for (local_d4 = 2; local_d4 < local_d2; local_d4 = local_d4 + 1) {
    operator[]((IPGMContext *)local_60,local_d4);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x6f) {
      object_00 = getObject((IPGMContext *)local_a0);
      pCVar7 = c.object;
      pAVar6 = r_code::View::code((View *)c.object,0);
      IPGMContext(&local_108,object_00,(View *)pCVar7,pAVar6,0,(InputLessPGMOverlay *)0x0,VIEW);
      operator=((IPGMContext *)local_a0,&local_108);
      ~IPGMContext(&local_108);
    }
    else {
      operator[]((IPGMContext *)local_60,local_d4);
      uVar3 = r_code::Atom::asIndex();
      getChild(&local_168,(IPGMContext *)local_a0,uVar3);
      operator*(&local_138,&local_168);
      operator=((IPGMContext *)local_a0,&local_138);
      ~IPGMContext(&local_138);
      ~IPGMContext(&local_168);
    }
  }
  operator[]((IPGMContext *)local_a0,0);
  bVar2 = r_code::Atom::getDescriptor();
  uVar5 = (uint)bVar2;
  if (uVar5 - 0xc1 < 2) {
LAB_00212986:
    if (c.super__Context.code._4_4_ == 5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"IPGMContext",&local_191);
      ::debug(&local_169);
      DebugStream::operator<<((DebugStream *)&local_169,"This will never work, aborting");
      DebugStream::~DebugStream((DebugStream *)&local_169);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      operator[]((IPGMContext *)local_a0,0xd);
      r_code::Atom::trace();
      exit(0);
    }
    pGVar8 = View::get_host((View *)c.object);
    *object = pGVar8;
    pAVar6 = operator[]((IPGMContext *)local_a0,0xc);
    *view_oid = (ulong)*(uint *)pAVar6;
    *object_type = TYPE_VIEW;
LAB_00212b03:
    operator[]((IPGMContext *)local_60,local_d2);
    uVar4 = r_code::Atom::asIndex();
    *(undefined2 *)&((cptr.view)->super_View).super__Object._vptr__Object = uVar4;
    c.view._0_4_ = 0;
  }
  else {
    if (uVar5 - 0xc3 < 2) {
LAB_00212954:
      *object_type = TYPE_OBJECT;
      pCVar7 = getObject((IPGMContext *)local_a0);
      *object = pCVar7;
      goto LAB_00212b03;
    }
    if (uVar5 == 200) goto LAB_00212986;
    if (uVar5 - 0xc9 < 6) goto LAB_00212954;
    *object = (void *)0x0;
    *object_type = TYPE_UNDEFINED;
    c.view._0_4_ = 1;
  }
  ~IPGMContext((IPGMContext *)local_a0);
LAB_00212b52:
  ~IPGMContext((IPGMContext *)local_60);
  return;
}

Assistant:

void IPGMContext::getMember(void *&object, uint64_t &view_oid, ObjectType &object_type, int16_t &member_index) const
{
    if ((*this)[0].getDescriptor() != Atom::I_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext cptr = IPGMContext(this->object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data); // dereference manually (1 offset) to retain the cptr as is.

    if (cptr[0].getDescriptor() != Atom::C_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext c = *cptr.getChild(1); // this, vl_ptr, value_ptr or rptr.
    uint16_t atom_count = cptr.getChildrenCount();

    for (uint16_t i = 2; i < atom_count; ++i) { // stop before the last iptr.
        if (cptr[i].getDescriptor() == Atom::VIEW) {
            c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
        } else {
            c = *c.getChild(cptr[i].asIndex());
        }
    }

    // at this point, c is an iptr dereferenced to an object or a view; the next iptr holds the member index.
    // c is pointing at the first atom of an object or a view.
    switch (c[0].getDescriptor()) {
    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        object_type = TYPE_OBJECT;
        object = c.getObject();
        break;

    case Atom::GROUP:
    case Atom::SET: // dynamically generated views can be sets.
    case Atom::S_SET: // views are always copied; set the object to the view's group on which to perform an operation for the view's oid.
        if (c.data == VALUE_ARRAY) {
            // FIXME: I'm not sure how this could ever have worked
            debug("IPGMContext") << "This will never work, aborting";
            c[VIEW_CODE_MAX_SIZE].trace();
            exit(0);
            object = (Group *)c[VIEW_CODE_MAX_SIZE].atom; // first reference of grp in a view stored in athe value array.
        } else {
            object = c.view->get_host();
        }

        view_oid = c[VIEW_OID].atom; // oid is hidden at the end of the view code; stored directly as a uint64.
        object_type = TYPE_VIEW;
        break;

    default: // atomic value or ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        return;
    }

    // get the index held by the last iptr.
    member_index = cptr[atom_count].asIndex();
}